

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

void renderer_NUMERIC_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  wchar_t nbuf_00;
  int iVar1;
  int local_9c;
  wchar_t palette_index_1;
  bool local_8d;
  wchar_t local_8c;
  _Bool o_1;
  wchar_t v_1;
  int iStack_80;
  _Bool o;
  wchar_t v;
  wchar_t palette_index;
  wchar_t i;
  wchar_t ac;
  wchar_t vc;
  ui_entry_combiner_funcs_conflict combiner;
  wchar_t *buffer;
  wchar_t nbuf;
  wchar_t color_offset;
  loc_conflict p;
  ui_entry_details *details_local;
  wchar_t n_local;
  wchar_t *auxvals_local;
  wchar_t *vals_local;
  wchar_t nlabel_local;
  wchar_t *label_local;
  
  _nbuf = details->value_position;
  buffer._4_4_ = 0;
  if ((details->alternate_color_first & 1U) != 0) {
    buffer._4_4_ = 7;
  }
  nbuf_00 = info->ndigit + (uint)(info->sign != L'\0');
  combiner.vec_func =
       (_func_void_wchar_t_wchar_t_ptr_wchar_t_ptr_int_ptr_int_ptr *)mem_alloc((long)nbuf_00 << 2);
  if (((L'\r' < info->ncolors) && (L'\x05' < info->nlabcolors)) && (L'\x06' < info->nsym)) {
    for (v = L'\0'; v < n; v = v + L'\x01') {
      if ((vals[v] == L'\x7fffffff') || ((vals[v] == L'\0' && (auxvals[v] == L'\x7fffffff')))) {
        iStack_80 = 0;
        format_int(L'\0',false,*info->symbols,*info->symbols,true,info->sign == L'\x01',nbuf_00,
                   (wchar_t *)combiner.vec_func);
      }
      else if (vals[v] == L'\x7ffffffe') {
        iStack_80 = 1;
        format_int(L'\0',false,info->symbols[1],info->symbols[1],true,info->sign == L'\x01',nbuf_00,
                   (wchar_t *)combiner.vec_func);
      }
      else if (vals[v] < L'\x01') {
        if (vals[v] < L'\0') {
          iStack_80 = 4;
          if (vals[v] != L'\x80000000') {
            v_1 = -vals[v];
          }
          else {
            v_1 = L'\x7fffffff';
          }
          o_1 = vals[v] == L'\x80000000';
          format_int(v_1,o_1,info->symbols[2],info->symbols[4],false,info->sign != L'\0',nbuf_00,
                     (wchar_t *)combiner.vec_func);
        }
        else if (((auxvals[v] < L'\x01') || (auxvals[v] == L'\x7fffffff')) ||
                (auxvals[v] == L'\x7ffffffe')) {
          if (((auxvals[v] < L'\0') && (auxvals[v] != L'\x7fffffff')) &&
             (auxvals[v] != L'\x7ffffffe')) {
            iStack_80 = 6;
            if (auxvals[v] != L'\x80000000') {
              local_8c = -vals[v];
            }
            else {
              local_8c = L'\x7fffffff';
            }
            local_8d = auxvals[v] == L'\x80000000';
            format_int(local_8c,local_8d,info->symbols[2],info->symbols[6],false,info->sign != L'\0'
                       ,nbuf_00,(wchar_t *)combiner.vec_func);
          }
          else {
            iStack_80 = 2;
            format_int(L'\0',false,info->symbols[2],info->symbols[3],true,info->sign == L'\x01',
                       nbuf_00,(wchar_t *)combiner.vec_func);
          }
        }
        else {
          iStack_80 = 5;
          format_int(auxvals[v],false,info->symbols[2],info->symbols[5],true,info->sign == L'\x01',
                     nbuf_00,(wchar_t *)combiner.vec_func);
        }
      }
      else {
        iStack_80 = 3;
        format_int(vals[v],false,info->symbols[2],info->symbols[3],true,info->sign == L'\x01',
                   nbuf_00,(wchar_t *)combiner.vec_func);
      }
      safe_queue_chars(nbuf,color_offset,nbuf_00,info->colors[(int)(iStack_80 + buffer._4_4_)],
                       (wchar_t *)combiner.vec_func);
      if (info->units_nlabel != L'\0') {
        safe_queue_chars(nbuf + nbuf_00,color_offset,info->units_nlabel,
                         info->colors[(int)(iStack_80 + buffer._4_4_)],info->units_label);
      }
      _nbuf = (loc_conflict)loc_sum((loc)_nbuf,(loc)details->position_step);
      buffer._4_4_ = buffer._4_4_ ^ 7;
    }
    mem_free(combiner.vec_func);
    if ((L'\0' < nlabel) || ((details->show_combined & 1U) != 0)) {
      iVar1 = ui_entry_combiner_get_funcs(info->combiner_index,(ui_entry_combiner_funcs *)&ac);
      if (iVar1 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                      ,0x445,
                      "void renderer_NUMERIC_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                     );
      }
      (*combiner.finish_func)((ui_entry_combiner_state_conflict *)n);
      if (L'\0' < nlabel) {
        if ((details->known_rune & 1U) == 0) {
          local_9c = 0;
        }
        else if (((i == L'\0') || (i == L'\x7fffffff')) || (i == L'\x7ffffffe')) {
          if (((palette_index == L'\0') || (palette_index == L'\x7fffffff')) ||
             (palette_index == L'\x7ffffffe')) {
            local_9c = 1;
          }
          else if (palette_index < L'\x01') {
            local_9c = 5;
          }
          else {
            local_9c = 4;
          }
        }
        else if (i < L'\x01') {
          local_9c = 3;
        }
        else {
          local_9c = 2;
        }
        if ((details->vertical_label & 1U) == 0) {
          safe_queue_chars((details->label_position).x,(details->label_position).y,nlabel,
                           info->label_colors[local_9c],label);
        }
        else {
          _nbuf = details->label_position;
          for (v = L'\0'; v < nlabel; v = v + L'\x01') {
            Term_putch(nbuf,color_offset,info->label_colors[local_9c],label[v]);
            color_offset = color_offset + L'\x01';
          }
        }
      }
      if ((details->show_combined & 1U) != 0) {
        show_combined_generic(info,details,i,palette_index);
      }
    }
    return;
  }
  __assert_fail("info->ncolors >= 14 && info->nlabcolors >= 6 && info->nsym >= 7",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                ,0x3ec,
                "void renderer_NUMERIC_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
               );
}

Assistant:

static void renderer_NUMERIC_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 7 : 0;
	int nbuf = info->ndigit + ((info->sign == UI_ENTRY_NO_SIGN) ? 0 : 1);
	wchar_t *buffer = mem_alloc(nbuf * sizeof(*buffer));
	struct ui_entry_combiner_funcs combiner;
	int vc, ac;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 14 && info->nlabcolors >= 6 && info->nsym >= 7);

	for (i = 0; i < n; ++i) {
		int palette_index;

		if (vals[i] == UI_ENTRY_UNKNOWN_VALUE || (vals[i] == 0 &&
			auxvals[i] == UI_ENTRY_UNKNOWN_VALUE)) {
			palette_index = 0;
			format_int(0, false, info->symbols[0],
				info->symbols[0], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN, nbuf,
				buffer);
		} else if (vals[i] == UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 1;
			format_int(0, false, info->symbols[1],
				info->symbols[1], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN, nbuf,
				buffer);
		} else if (vals[i] > 0) {
			palette_index = 3;
			format_int(vals[i], false, info->symbols[2],
				info->symbols[3], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN,
				nbuf, buffer);
		} else if (vals[i] < 0) {
			int v;
			bool o;

			palette_index = 4;
			if (vals[i] == INT_MIN) {
				v = -(INT_MIN + 1);
				o = true;
			} else {
				v = -vals[i];
				o = false;
			}
			format_int(v, o, info->symbols[2], info->symbols[4],
				false, info->sign != UI_ENTRY_NO_SIGN, nbuf,
				buffer);
		} else if (auxvals[i] > 0 &&
			auxvals[i] != UI_ENTRY_UNKNOWN_VALUE &&
			auxvals[i] != UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 5;
			format_int(auxvals[i], false, info->symbols[2],
				info->symbols[5], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN, nbuf,
				buffer);
		} else if (auxvals[i] < 0 &&
			auxvals[i] != UI_ENTRY_UNKNOWN_VALUE &&
			auxvals[i] != UI_ENTRY_VALUE_NOT_PRESENT) {
			int v;
			bool o;

			palette_index = 6;
			if (auxvals[i] == INT_MIN) {
				v = -(INT_MIN + 1);
				o = true;
			} else {
				v = -vals[i];
				o = false;
			}
			format_int(v, o, info->symbols[2], info->symbols[6],
				false, info->sign != UI_ENTRY_NO_SIGN, nbuf,
				buffer);
		} else {
			palette_index = 2;
			format_int(0, false, info->symbols[2],
				info->symbols[3], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN,
				nbuf, buffer);
		}
		safe_queue_chars(p.x, p.y, nbuf,
			info->colors[palette_index + color_offset], buffer);
		if (info->units_nlabel != 0) {
			safe_queue_chars(p.x + nbuf, p.y, info->units_nlabel,
				info->colors[palette_index + color_offset],
				info->units_label);
		}
		p = loc_sum(p, details->position_step);
		color_offset ^= 7;
	}

	mem_free(buffer);

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}
	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		int palette_index;

		if (! details->known_rune) {
			palette_index = 0;
		} else if (vc == 0 || vc == UI_ENTRY_UNKNOWN_VALUE ||
			vc == UI_ENTRY_VALUE_NOT_PRESENT) {
			if (ac == 0 || ac == UI_ENTRY_UNKNOWN_VALUE ||
				ac == UI_ENTRY_VALUE_NOT_PRESENT) {
				palette_index = 1;
			} else if (ac > 0) {
				palette_index = 4;
			} else {
				palette_index = 5;
			}
		} else if (vc > 0) {
			palette_index = 2;
		} else {
			palette_index = 3;
		}
		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[palette_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[palette_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, vc, ac);
	}
}